

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

Symbol * slang::ast::ClassType::fromSyntax(Scope *scope,ClassDeclarationSyntax *syntax)

{
  bool bVar1;
  Symbol *pSVar2;
  Compilation *this;
  ClassType *pCVar3;
  long in_RSI;
  Scope *in_RDI;
  string_view sVar4;
  ClassType *result;
  Compilation *comp;
  ClassDeclarationSyntax *in_stack_00000540;
  Scope *in_stack_00000548;
  ClassType *in_stack_00000550;
  Token *in_stack_ffffffffffffffc0;
  Compilation *in_stack_ffffffffffffffd8;
  Scope *in_stack_ffffffffffffffe0;
  
  if ((*(long *)(in_RSI + 0x88) != 0) &&
     (bVar1 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParameterDeclarationBaseSyntax>::
              empty((SeparatedSyntaxList<slang::syntax::ParameterDeclarationBaseSyntax> *)0x5cc852),
     !bVar1)) {
    pSVar2 = GenericClassDefSymbol::fromSyntax
                       (in_stack_ffffffffffffffe0,
                        (ClassDeclarationSyntax *)in_stack_ffffffffffffffd8);
    return pSVar2;
  }
  this = Scope::getCompilation(in_RDI);
  sVar4 = parsing::Token::valueText(in_stack_ffffffffffffffc0);
  parsing::Token::location((Token *)(in_RSI + 0x78));
  pCVar3 = BumpAllocator::
           emplace<slang::ast::ClassType,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                     (&this->super_BumpAllocator,in_stack_ffffffffffffffd8,
                      (basic_string_view<char,_std::char_traits<char>_> *)sVar4._M_str,
                      (SourceLocation *)sVar4._M_len);
  populate(in_stack_00000550,in_stack_00000548,in_stack_00000540);
  return (Symbol *)pCVar3;
}

Assistant:

const Symbol& ClassType::fromSyntax(const Scope& scope, const ClassDeclarationSyntax& syntax) {
    // If this class declaration has parameter ports it's actually a generic class definition.
    // Create that now and wait until someone specializes it in order to get an actual type.
    if (syntax.parameters && !syntax.parameters->declarations.empty())
        return GenericClassDefSymbol::fromSyntax(scope, syntax);

    auto& comp = scope.getCompilation();
    auto result = comp.emplace<ClassType>(comp, syntax.name.valueText(), syntax.name.location());
    result->populate(scope, syntax);
    return *result;
}